

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# string_util.cpp
# Opt level: O1

vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true> *
duckdb::StringUtil::SplitWithParentheses
          (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true>
           *__return_storage_ptr__,string *str,char delimiter,char par_open,char par_close)

{
  pointer pcVar1;
  InvalidInputException *pIVar2;
  ulong uVar3;
  char ch;
  string current;
  stack<char,_std::deque<char,_std::allocator<char>_>_> parentheses;
  char local_111;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *local_110;
  value_type local_108;
  string local_e8;
  _Deque_base<char,_std::allocator<char>_> local_c8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_70;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_50;
  
  (__return_storage_ptr__->
  super_vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ).
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (__return_storage_ptr__->
  super_vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ).
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (__return_storage_ptr__->
  super_vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ).
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  local_108._M_dataplus._M_p = (pointer)&local_108.field_2;
  local_108._M_string_length = 0;
  local_108.field_2._M_local_buf[0] = '\0';
  local_c8._M_impl.super__Deque_impl_data._M_finish._M_last = (char *)0x0;
  local_c8._M_impl.super__Deque_impl_data._M_finish._M_node = (_Map_pointer)0x0;
  local_c8._M_impl.super__Deque_impl_data._M_finish._M_cur = (char *)0x0;
  local_c8._M_impl.super__Deque_impl_data._M_finish._M_first = (char *)0x0;
  local_c8._M_impl.super__Deque_impl_data._M_start._M_last = (_Elt_pointer)0x0;
  local_c8._M_impl.super__Deque_impl_data._M_start._M_node = (_Map_pointer)0x0;
  local_c8._M_impl.super__Deque_impl_data._M_start._M_cur = (char *)0x0;
  local_c8._M_impl.super__Deque_impl_data._M_start._M_first = (_Elt_pointer)0x0;
  local_c8._M_impl.super__Deque_impl_data._M_map = (_Map_pointer)0x0;
  local_c8._M_impl.super__Deque_impl_data._M_map_size = 0;
  local_110 = (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               *)__return_storage_ptr__;
  std::_Deque_base<char,_std::allocator<char>_>::_M_initialize_map(&local_c8,0);
  if (str->_M_string_length != 0) {
    uVar3 = 0;
    do {
      local_111 = (str->_M_dataplus)._M_p[uVar3];
      if (local_111 == par_open) {
        if (local_c8._M_impl.super__Deque_impl_data._M_finish._M_cur ==
            local_c8._M_impl.super__Deque_impl_data._M_finish._M_last + -1) {
          ::std::deque<char,std::allocator<char>>::_M_push_back_aux<char_const&>
                    ((deque<char,std::allocator<char>> *)&local_c8,&local_111);
        }
        else {
          *local_c8._M_impl.super__Deque_impl_data._M_finish._M_cur = local_111;
          local_c8._M_impl.super__Deque_impl_data._M_finish._M_cur =
               local_c8._M_impl.super__Deque_impl_data._M_finish._M_cur + 1;
        }
      }
      if (local_111 == par_close) {
        if (local_c8._M_impl.super__Deque_impl_data._M_finish._M_cur ==
            local_c8._M_impl.super__Deque_impl_data._M_start._M_cur) {
          pIVar2 = (InvalidInputException *)__cxa_allocate_exception(0x10);
          local_e8._M_dataplus._M_p = (pointer)&local_e8.field_2;
          ::std::__cxx11::string::_M_construct<char_const*>
                    ((string *)&local_e8,"Incongruent parentheses in string: \'%s\'","");
          local_50._M_dataplus._M_p = (pointer)&local_50.field_2;
          pcVar1 = (str->_M_dataplus)._M_p;
          ::std::__cxx11::string::_M_construct<char*>
                    ((string *)&local_50,pcVar1,pcVar1 + str->_M_string_length);
          InvalidInputException::InvalidInputException<std::__cxx11::string>
                    (pIVar2,&local_e8,&local_50);
          __cxa_throw(pIVar2,&InvalidInputException::typeinfo,::std::runtime_error::~runtime_error);
        }
        if (local_c8._M_impl.super__Deque_impl_data._M_finish._M_cur ==
            local_c8._M_impl.super__Deque_impl_data._M_finish._M_first) {
          operator_delete(local_c8._M_impl.super__Deque_impl_data._M_finish._M_first);
          local_c8._M_impl.super__Deque_impl_data._M_finish._M_first =
               local_c8._M_impl.super__Deque_impl_data._M_finish._M_node[-1];
          local_c8._M_impl.super__Deque_impl_data._M_finish._M_last =
               local_c8._M_impl.super__Deque_impl_data._M_finish._M_first + 0x200;
          local_c8._M_impl.super__Deque_impl_data._M_finish._M_cur =
               local_c8._M_impl.super__Deque_impl_data._M_finish._M_first + 0x1ff;
          local_c8._M_impl.super__Deque_impl_data._M_finish._M_node =
               local_c8._M_impl.super__Deque_impl_data._M_finish._M_node + -1;
        }
        else {
          local_c8._M_impl.super__Deque_impl_data._M_finish._M_cur =
               local_c8._M_impl.super__Deque_impl_data._M_finish._M_cur + -1;
        }
      }
      if (local_111 == delimiter &&
          local_c8._M_impl.super__Deque_impl_data._M_finish._M_cur ==
          local_c8._M_impl.super__Deque_impl_data._M_start._M_cur) {
        ::std::
        vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ::push_back(local_110,&local_108);
        local_108._M_string_length = 0;
        *local_108._M_dataplus._M_p = '\0';
      }
      else {
        ::std::__cxx11::string::push_back((char)&local_108);
      }
      uVar3 = uVar3 + 1;
    } while (uVar3 < str->_M_string_length);
  }
  if (local_108._M_string_length != 0) {
    ::std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::push_back(local_110,&local_108);
  }
  if (local_c8._M_impl.super__Deque_impl_data._M_finish._M_cur !=
      local_c8._M_impl.super__Deque_impl_data._M_start._M_cur) {
    pIVar2 = (InvalidInputException *)__cxa_allocate_exception(0x10);
    local_e8._M_dataplus._M_p = (pointer)&local_e8.field_2;
    ::std::__cxx11::string::_M_construct<char_const*>
              ((string *)&local_e8,"Incongruent parentheses in string: \'%s\'","");
    local_70._M_dataplus._M_p = (pointer)&local_70.field_2;
    pcVar1 = (str->_M_dataplus)._M_p;
    ::std::__cxx11::string::_M_construct<char*>
              ((string *)&local_70,pcVar1,pcVar1 + str->_M_string_length);
    InvalidInputException::InvalidInputException<std::__cxx11::string>(pIVar2,&local_e8,&local_70);
    __cxa_throw(pIVar2,&InvalidInputException::typeinfo,::std::runtime_error::~runtime_error);
  }
  std::_Deque_base<char,_std::allocator<char>_>::~_Deque_base(&local_c8);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_108._M_dataplus._M_p != &local_108.field_2) {
    operator_delete(local_108._M_dataplus._M_p);
  }
  return (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true>
          *)local_110;
}

Assistant:

vector<string> StringUtil::SplitWithParentheses(const string &str, char delimiter, char par_open, char par_close) {
	vector<string> result;
	string current;
	stack<char> parentheses;

	for (size_t i = 0; i < str.size(); ++i) {
		char ch = str[i];

		// stack to keep track if we are within parentheses
		if (ch == par_open) {
			parentheses.push(ch);
		}
		if (ch == par_close) {
			if (!parentheses.empty()) {
				parentheses.pop();
			} else {
				throw InvalidInputException("Incongruent parentheses in string: '%s'", str);
			}
		}
		// split if not within parentheses
		if (parentheses.empty() && ch == delimiter) {
			result.push_back(current);
			current.clear();
		} else {
			current += ch;
		}
	}
	// Add the last segment
	if (!current.empty()) {
		result.push_back(current);
	}
	if (!parentheses.empty()) {
		throw InvalidInputException("Incongruent parentheses in string: '%s'", str);
	}
	return result;
}